

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O3

UniformCollection *
deqp::gles31::Functional::anon_unknown_1::UniformCollection::nestedArraysStructs
          (DataType type0,DataType type1,char *nameSuffix)

{
  UniformCollection *this;
  StructType *pSVar1;
  long *plVar2;
  StructType *this_00;
  StructType *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *plVar4;
  Precision precision;
  Precision precision_00;
  DataType basicType;
  long *name_;
  VarType local_e8;
  long lStack_d0;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  VarType local_a8;
  ulong local_90;
  char *local_88;
  ulong local_80;
  long *local_78 [2];
  long local_68 [2];
  StructType *local_58;
  UniformCollection *local_50;
  VarType local_48;
  
  local_50 = (UniformCollection *)operator_new(0x30);
  (local_50->m_uniforms).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_50->m_uniforms).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_50->m_uniforms).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_50->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_50->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_50->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = (ulong)type0;
  local_80 = (ulong)type1;
  pSVar1 = (StructType *)operator_new(0x38);
  local_e8._0_8_ = (long)&local_e8 + 0x10U;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"structType","");
  local_88 = nameSuffix;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_e8);
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 == paVar3) {
    local_b8._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_b8._8_8_ = plVar2[3];
    local_c8._0_8_ = &local_b8;
  }
  else {
    local_b8._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_c8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar2;
  }
  local_c8._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar2 + 1);
  *plVar2 = (long)paVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pSVar1,(char *)local_c8._0_8_,(allocator<char> *)local_78);
  (pSVar1->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar1->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar1->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_,local_b8._M_allocated_capacity + 1);
  }
  if (local_e8._0_8_ != (long)&local_e8 + 0x10U) {
    operator_delete((void *)local_e8._0_8_,local_e8.m_data._8_8_ + 1);
  }
  this_00 = (StructType *)operator_new(0x38);
  local_e8._0_8_ = (long)&local_e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"subStructType","");
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_e8);
  local_c8._0_8_ = &local_b8;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 == paVar3) {
    local_b8._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_b8._8_8_ = plVar2[3];
  }
  else {
    local_b8._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_c8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar2;
  }
  local_c8._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar2 + 1);
  *plVar2 = (long)paVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this_00,(char *)local_c8._0_8_,(allocator<char> *)local_78);
  (this_00->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_,local_b8._M_allocated_capacity + 1);
  }
  if (local_e8._0_8_ != (long)&local_e8 + 0x10U) {
    operator_delete((void *)local_e8._0_8_,local_e8.m_data._8_8_ + 1);
  }
  this_01 = (StructType *)operator_new(0x38);
  local_e8._0_8_ = (long)&local_e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"subSubStructType","");
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_e8);
  local_c8._0_8_ = &local_b8;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 == paVar3) {
    local_b8._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_b8._8_8_ = plVar2[3];
  }
  else {
    local_b8._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_c8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar2;
  }
  local_c8._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar2 + 1);
  *plVar2 = (long)paVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this_01,(char *)local_c8._0_8_,(allocator<char> *)local_78);
  (this_01->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_,local_b8._M_allocated_capacity + 1);
  }
  precision = (uint)(type0 - TYPE_BOOL < 4) * 2 + PRECISION_MEDIUMP;
  if (local_e8._0_8_ != (long)&local_e8 + 0x10U) {
    operator_delete((void *)local_e8._0_8_,local_e8.m_data._8_8_ + 1);
  }
  local_58 = pSVar1;
  glu::VarType::VarType((VarType *)local_c8,(DataType)local_90,precision);
  glu::StructType::addMember(this_01,"mss0",(VarType *)local_c8);
  precision_00 = (uint)(type1 - TYPE_BOOL < 4) * 2 + PRECISION_MEDIUMP;
  glu::VarType::~VarType((VarType *)local_c8);
  basicType = (DataType)local_80;
  glu::VarType::VarType((VarType *)local_c8,basicType,precision_00);
  glu::StructType::addMember(this_01,"mss1",(VarType *)local_c8);
  glu::VarType::~VarType((VarType *)local_c8);
  glu::VarType::VarType((VarType *)local_c8,basicType,precision_00);
  glu::StructType::addMember(this_00,"ms0",(VarType *)local_c8);
  glu::VarType::~VarType((VarType *)local_c8);
  glu::VarType::VarType(&local_e8,(DataType)local_90,precision);
  glu::VarType::VarType((VarType *)local_c8,&local_e8,2);
  pSVar1 = local_58;
  glu::StructType::addMember(this_00,"ms1",(VarType *)local_c8);
  glu::VarType::~VarType((VarType *)local_c8);
  glu::VarType::~VarType(&local_e8);
  glu::VarType::VarType(&local_e8,this_01);
  glu::VarType::VarType((VarType *)local_c8,&local_e8,2);
  glu::StructType::addMember(this_00,"ms2",(VarType *)local_c8);
  glu::VarType::~VarType((VarType *)local_c8);
  glu::VarType::~VarType(&local_e8);
  glu::VarType::VarType((VarType *)local_c8,(DataType)local_90,precision);
  glu::StructType::addMember(pSVar1,"m0",(VarType *)local_c8);
  glu::VarType::~VarType((VarType *)local_c8);
  glu::VarType::VarType((VarType *)local_c8,this_00);
  glu::StructType::addMember(pSVar1,"m1",(VarType *)local_c8);
  this = local_50;
  glu::VarType::~VarType((VarType *)local_c8);
  glu::VarType::VarType((VarType *)local_c8,(DataType)local_80,precision_00);
  glu::StructType::addMember(pSVar1,"m2",(VarType *)local_c8);
  glu::VarType::~VarType((VarType *)local_c8);
  addStructType(this,this_01);
  addStructType(this,this_00);
  addStructType(this,pSVar1);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"u_var","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_78);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_e8.m_data._8_8_ = *plVar4;
    lStack_d0 = plVar2[3];
    name_ = (long *)((long)&local_e8 + 0x10U);
  }
  else {
    local_e8.m_data._8_8_ = *plVar4;
    name_ = (long *)*plVar2;
  }
  local_e8.m_data.basic = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar2 + 1);
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_e8._0_8_ = name_;
  glu::VarType::VarType(&local_48,pSVar1);
  Uniform::Uniform((Uniform *)local_c8,(char *)name_,&local_48);
  addUniform(this,(Uniform *)local_c8);
  glu::VarType::~VarType(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_,local_b8._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_48);
  if (local_e8._0_8_ != (long)&local_e8 + 0x10U) {
    operator_delete((void *)local_e8._0_8_,local_e8.m_data._8_8_ + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return this;
}

Assistant:

static UniformCollection* nestedArraysStructs (const glu::DataType type0, const glu::DataType type1, const char* const nameSuffix = "")
	{
		UniformCollection* const res		= new UniformCollection;
		const glu::Precision prec0			= glu::isDataTypeBoolOrBVec(type0) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		const glu::Precision prec1			= glu::isDataTypeBoolOrBVec(type1) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		StructType* const structType		= new StructType((string("structType") + nameSuffix).c_str());
		StructType* const subStructType		= new StructType((string("subStructType") + nameSuffix).c_str());
		StructType* const subSubStructType	= new StructType((string("subSubStructType") + nameSuffix).c_str());

		subSubStructType->addMember("mss0", glu::VarType(type0, prec0));
		subSubStructType->addMember("mss1", glu::VarType(type1, prec1));

		subStructType->addMember("ms0", glu::VarType(type1, prec1));
		subStructType->addMember("ms1", glu::VarType(glu::VarType(type0, prec0), 2));
		subStructType->addMember("ms2", glu::VarType(glu::VarType(subSubStructType), 2));

		structType->addMember("m0", glu::VarType(type0, prec0));
		structType->addMember("m1", glu::VarType(subStructType));
		structType->addMember("m2", glu::VarType(type1, prec1));

		res->addStructType(subSubStructType);
		res->addStructType(subStructType);
		res->addStructType(structType);

		res->addUniform(Uniform((string("u_var") + nameSuffix).c_str(), glu::VarType(structType)));

		return res;
	}